

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void __thiscall
jessilib::callback_with_iterations::callback_with_iterations
          (callback_with_iterations *this,callback_with_iterations *in_callback)

{
  undefined8 uVar1;
  
  *(undefined8 *)&(this->m_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_callback).super__Function_base._M_functor + 8) = 0;
  (this->m_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_callback)._M_invoker = (in_callback->m_callback)._M_invoker;
  if ((in_callback->m_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(in_callback->m_callback).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_callback).super__Function_base._M_functor =
         *(undefined8 *)&(in_callback->m_callback).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->m_callback).super__Function_base._M_functor + 8) = uVar1;
    (this->m_callback).super__Function_base._M_manager =
         (in_callback->m_callback).super__Function_base._M_manager;
    (in_callback->m_callback).super__Function_base._M_manager = (_Manager_type)0x0;
    (in_callback->m_callback)._M_invoker = (_Invoker_type)0x0;
  }
  (this->m_iterations).super___atomic_base<unsigned_long>._M_i =
       (in_callback->m_iterations).super___atomic_base<unsigned_long>._M_i;
  cancel_token::cancel_token(&this->m_cancel_token);
  return;
}

Assistant:

callback_with_iterations(callback_with_iterations&& in_callback)
		: m_callback{ std::move(in_callback.m_callback) },
		m_iterations{ in_callback.m_iterations.load() } {
		// Empty ctor body
	}